

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

__sighandler_t __thiscall
obs::signal<void_()>::~signal(signal<void_()> *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  slot<void_()> *psVar2;
  __sighandler_t extraout_RAX;
  slot_list *this_00;
  iterator __end0;
  iterator __begin0;
  iterator iStack_68;
  iterator local_40;
  
  (this->super_signal_base)._vptr_signal_base = (_func_int **)&PTR__signal_0010da48;
  this_00 = &this->m_slots;
  safe_list<obs::slot<void_()>_>::begin(&local_40,this_00);
  safe_list<obs::slot<void_()>_>::end(&iStack_68,this_00);
  while( true ) {
    bVar1 = safe_list<obs::slot<void_()>_>::iterator::operator!=(&local_40,&iStack_68);
    if (!bVar1) break;
    psVar2 = safe_list<obs::slot<void_()>_>::iterator::operator*(&local_40);
    if (psVar2 != (slot<void_()> *)0x0) {
      (*(psVar2->super_slot_base)._vptr_slot_base[1])(psVar2);
    }
    safe_list<obs::slot<void_()>_>::iterator::operator++(&local_40);
  }
  safe_list<obs::slot<void_()>_>::iterator::~iterator(&iStack_68);
  safe_list<obs::slot<void_()>_>::iterator::~iterator(&local_40);
  safe_list<obs::slot<void_()>_>::~safe_list(this_00);
  return extraout_RAX;
}

Assistant:

~signal() {
    for (auto slot : m_slots)
      delete slot;
  }